

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O2

void __thiscall OPLmusicBlock::OPLmusicBlock(OPLmusicBlock *this)

{
  OPLio *pOVar1;
  int iVar2;
  
  musicBlock::musicBlock(&this->super_musicBlock);
  this->_vptr_OPLmusicBlock = (_func_int **)&PTR__OPLmusicBlock_006e9d48;
  FCriticalSection::FCriticalSection(&this->ChipAccess);
  (this->super_musicBlock).scoredata = (BYTE *)0x0;
  this->NextTickIn = 0.0;
  this->LastOffset = 0.0;
  iVar2 = 2;
  if (opl_numchips.Value < 2) {
    iVar2 = opl_numchips.Value;
  }
  this->NumChips = iVar2;
  this->Looping = false;
  this->FullPan = false;
  (this->super_musicBlock).io = (OPLio *)0x0;
  pOVar1 = (OPLio *)operator_new(0x58);
  pOVar1->_vptr_OPLio = (_func_int **)&PTR__OPLio_006e9358;
  (this->super_musicBlock).io = pOVar1;
  return;
}

Assistant:

OPLmusicBlock::OPLmusicBlock()
{
	scoredata = NULL;
	NextTickIn = 0;
	LastOffset = 0;
	NumChips = MIN(*opl_numchips, 2);
	Looping = false;
	FullPan = false;
	io = NULL;
	io = new OPLio;
}